

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

bool __thiscall OB::Parg::find(Parg *this,string *_key)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
          ::find(&(this->data_)._M_t,_key);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
             ::at(&this->data_,_key);
    return pmVar2->seen_;
  }
  __assert_fail("data_.find(_key) != data_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/parg.hh"
                ,0x10a,"bool OB::Parg::find(const std::string) const");
}

Assistant:

bool find(std::string const _key) const
  {
    // key must exist
    assert(data_.find(_key) != data_.end());
    return data_.at(_key).seen_;
  }